

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O0

void * Curl_ssl_get_internals(Curl_easy *data,int sockindex,CURLINFO info,int n)

{
  undefined8 uVar1;
  Curl_cfilter *pCVar2;
  cf_call_data save;
  Curl_cfilter *cf;
  void *result;
  int n_local;
  CURLINFO info_local;
  int sockindex_local;
  Curl_easy *data_local;
  
  cf = (Curl_cfilter *)0x0;
  if ((data->conn != (connectdata *)0x0) &&
     (pCVar2 = get_ssl_filter(data->conn->cfilter[sockindex]), pCVar2 != (Curl_cfilter *)0x0)) {
    uVar1 = *(undefined8 *)((long)pCVar2->ctx + 0x38);
    *(Curl_easy **)((long)pCVar2->ctx + 0x38) = data;
    cf = (Curl_cfilter *)(*Curl_ssl->get_internals)((ssl_connect_data *)pCVar2->ctx,info);
    *(undefined8 *)((long)pCVar2->ctx + 0x38) = uVar1;
  }
  return cf;
}

Assistant:

void *Curl_ssl_get_internals(struct Curl_easy *data, int sockindex,
                             CURLINFO info, int n)
{
  void *result = NULL;
  (void)n;
  if(data->conn) {
    struct Curl_cfilter *cf;
    /* get first SSL filter in chain, if any is present */
    cf = get_ssl_filter(data->conn->cfilter[sockindex]);
    if(cf) {
      struct cf_call_data save;
      CF_DATA_SAVE(save, cf, data);
      result = Curl_ssl->get_internals(cf->ctx, info);
      CF_DATA_RESTORE(cf, save);
    }
  }
  return result;
}